

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O2

void test_string_traits(void)

{
  size_type *psVar1;
  size_type *psVar2;
  uint __line;
  bool bVar3;
  char *__assertion;
  undefined1 local_c0 [8];
  opt_str os_;
  opt_str os00;
  undefined1 local_70 [8];
  size_type sStack_68;
  undefined1 local_60 [8];
  opt_str os0;
  opt_str osA;
  
  local_c0 = (undefined1  [8])
             &os_.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length
  ;
  os_.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._0_2_ = 0;
  os_.super_compact_optional_base<string_empty_value>.super_type.value_._M_dataplus._M_p =
       (pointer)0x2;
  psVar1 = &os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length;
  os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._1_1_ = 0;
  os_.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._2_1_ = 0;
  os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._2_1_ = 0;
  os_.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ =
       &os00.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length;
  os00.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._0_2_ = 0;
  os00.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._2_1_ = 0;
  os00.super_compact_optional_base<string_empty_value>.super_type.value_._M_dataplus._M_p =
       (pointer)0x2;
  os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_dataplus._M_p =
       (pointer)0x0;
  os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._0_1_ = 0;
  local_60 = (undefined1  [8])psVar1;
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string
            ((string *)
             (os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
              _M_local_buf + 8),"",
             (allocator *)
             (os00.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
              _M_local_buf + 8));
  psVar2 = &osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length;
  os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._0_1_ =
       (undefined1)
       osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length;
  os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._1_1_ =
       (undefined1)
       (osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length >> 8)
  ;
  os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._2_1_ =
       (undefined1)
       (osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length >>
       0x10);
  os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._3_5_ =
       (undefined5)
       (osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length >>
       0x18);
  if ((size_type *)
      os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ == psVar2)
  {
    os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
    _M_allocated_capacity._0_3_ =
         (undefined3)
         osA.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
         _M_allocated_capacity;
    os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
    _M_allocated_capacity._3_4_ =
         (undefined4)
         ((ulong)osA.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._0_8_
         >> 0x18);
    os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._M_local_buf[7] =
         (char)((ulong)osA.super_compact_optional_base<string_empty_value>.super_type.value_.field_2
                       ._0_8_ >> 0x38);
    local_60 = (undefined1  [8])psVar1;
  }
  else {
    local_60 = (undefined1  [8])
               os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_;
  }
  os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_dataplus =
       osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_dataplus;
  osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_dataplus._M_p =
       (pointer)0x0;
  osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length =
       osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length &
       0xffffffffffffff00;
  os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ = psVar2;
  std::__cxx11::string::~string
            ((string *)
             (os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
              _M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             (os00.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
              _M_local_buf + 8),"A",
             (allocator *)
             (osA.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
              _M_local_buf + 0xf));
  if ((undefined1 *)
      os00.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ ==
      local_70) {
    osA.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
    _M_allocated_capacity = sStack_68;
    os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ = psVar2;
  }
  else {
    os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ =
         os00.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_;
  }
  local_70[0] = 0;
  os00.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ = local_70;
  std::__cxx11::string::~string
            ((string *)
             (os00.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
              _M_local_buf + 8));
  bVar3 = ak_toolbox::compact_optional_ns::detail_::compact_optional_base<string_empty_value>::
          has_value((compact_optional_base<string_empty_value> *)local_c0);
  if (bVar3) {
    __assertion = "!os_.has_value()";
    __line = 0x40;
  }
  else {
    bVar3 = ak_toolbox::compact_optional_ns::detail_::compact_optional_base<string_empty_value>::
            has_value((compact_optional_base<string_empty_value> *)
                      ((long)&os_.super_compact_optional_base<string_empty_value>.super_type.value_.
                              field_2 + 8));
    if (bVar3) {
      __assertion = "!os00.has_value()";
      __line = 0x41;
    }
    else {
      bVar3 = ak_toolbox::compact_optional_ns::detail_::compact_optional_base<string_empty_value>::
              has_value((compact_optional_base<string_empty_value> *)local_60);
      if (bVar3) {
        bVar3 = ak_toolbox::compact_optional_ns::detail_::compact_optional_base<string_empty_value>
                ::has_value((compact_optional_base<string_empty_value> *)
                            ((long)&os0.super_compact_optional_base<string_empty_value>.super_type.
                                    value_.field_2 + 8));
        if (bVar3) {
          std::__cxx11::string::~string
                    ((string *)
                     (os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
                      _M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_60);
          std::__cxx11::string::~string
                    ((string *)
                     (os_.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
                      _M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_c0);
          return;
        }
        __assertion = "osA.has_value()";
        __line = 0x43;
      }
      else {
        __assertion = "os0.has_value()";
        __line = 0x42;
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                ,__line,"void test_string_traits()");
}

Assistant:

void test_string_traits()
{
  typedef compact_optional<string_empty_value, class tag_X> opt_str;
  static_assert (sizeof(opt_str) == sizeof(std::string), "size waste");
  
  opt_str os_, os00(std::string("\0\0", 2)), os0(std::string("\0")), osA(std::string("A"));
  assert (!os_.has_value());
  assert (!os00.has_value());
  assert ( os0.has_value());
  assert ( osA.has_value());
}